

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

void __thiscall
Js::FunctionExecutionStateMachine::SetSimpleJitCallCount
          (FunctionExecutionStateMachine *this,uint16 simpleJitLimit)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  ushort uVar4;
  undefined4 *puVar5;
  FunctionEntryPointInfo *pFVar6;
  FunctionEntryPointInfo *pFVar7;
  Type TVar8;
  
  EVar2 = GetExecutionMode(this);
  if (EVar2 != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x149,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar3) goto LAB_006e4f59;
    *puVar5 = 0;
  }
  pFVar6 = FunctionBody::GetDefaultFunctionEntryPointInfo((this->owner).ptr);
  pFVar7 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  if (pFVar6 != pFVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x14a,
                                "(owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo())"
                                ,
                                "owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar3) {
LAB_006e4f59:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar4 = 0xff;
  if (simpleJitLimit < 0xff) {
    uVar4 = simpleJitLimit;
  }
  TVar8 = 0;
  if (simpleJitLimit != 0) {
    TVar8 = uVar4 - 1;
  }
  pFVar6 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  pFVar6->callsCount = TVar8;
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetSimpleJitCallCount(const uint16 simpleJitLimit) const
    {
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
        Assert(owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo());

        // Simple JIT counts down and transitions on overflow
        const uint8 limit = static_cast<uint8>(min(0xffui16, simpleJitLimit));
        owner->GetSimpleJitEntryPointInfo()->callsCount = limit == 0 ? 0 : limit - 1;
    }